

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O3

Bool handle_compress(bz_stream *strm)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  UChar ch_1;
  uint uVar9;
  char *pcVar10;
  UChar ch;
  long *plVar11;
  byte *pbVar12;
  int iVar13;
  bool is_last_block;
  
  bVar5 = false;
  bVar6 = false;
LAB_0010bab8:
  do {
    do {
      if (strm->total_in_lo32 == 2) goto LAB_0010bbc0;
    } while (strm->total_in_lo32 != 1);
    uVar7 = strm[1].total_out_hi32;
    uVar9 = strm[1].total_out_lo32;
    if ((int)uVar7 < (int)uVar9 && *(int *)(strm->next_in + 0x20) != 0) {
      pcVar10 = *(char **)(strm->next_in + 0x18);
      do {
        *pcVar10 = strm[1].next_in[(int)uVar7];
        uVar7 = strm[1].total_out_hi32 + 1;
        strm[1].total_out_hi32 = uVar7;
        pcVar4 = strm->next_in;
        iVar8 = *(int *)(pcVar4 + 0x20);
        *(int *)(pcVar4 + 0x20) = iVar8 + -1;
        pcVar10 = (char *)(*(long *)(pcVar4 + 0x18) + 1);
        *(char **)(pcVar4 + 0x18) = pcVar10;
        piVar1 = (int *)(pcVar4 + 0x24);
        *piVar1 = *piVar1 + 1;
        if (*piVar1 == 0) {
          *(int *)(pcVar4 + 0x28) = *(int *)(pcVar4 + 0x28) + 1;
        }
        uVar9 = strm[1].total_out_lo32;
        bVar3 = 1;
      } while ((iVar8 + -1 != 0) && ((int)uVar7 < (int)uVar9));
    }
    else {
      bVar3 = 0;
    }
    bVar5 = (bool)(bVar3 | bVar5);
    if (((int)uVar7 < (int)uVar9) ||
       (((uVar7 = strm->avail_in, uVar7 == 4 && (strm->total_in_hi32 == 0)) &&
        ((0xff < strm[1].total_in_lo32 || ((int)strm[1].total_in_hi32 < 1)))))) goto LAB_0010bde1;
    *(undefined4 *)((long)&strm[1].next_out + 4) = 0;
    strm[1].total_out_lo32 = 0;
    strm[1].total_out_hi32 = 0;
    strm[8].avail_in = 0xffffffff;
    memset(&strm[1].state,0,0x100);
    *(int *)&strm[8].field_0x14 = *(int *)&strm[8].field_0x14 + 1;
    strm->total_in_lo32 = 2;
    if (uVar7 == 3) {
      if ((strm->total_in_hi32 == 0) &&
         ((0xff < strm[1].total_in_lo32 || ((int)strm[1].total_in_hi32 < 1)))) goto LAB_0010bde1;
LAB_0010bbc0:
      uVar7 = strm->avail_in;
    }
    iVar8 = *(int *)((long)&strm[1].next_out + 4);
    uVar9 = strm[1].avail_out;
    if (uVar7 == 2) {
      if ((iVar8 < (int)uVar9) && (*(int *)(strm->next_in + 8) != 0)) {
        pbVar12 = *(byte **)strm->next_in;
        uVar7 = strm[1].total_in_lo32;
        do {
          bVar2 = *pbVar12;
          uVar9 = strm[1].total_in_hi32;
          if (uVar7 == bVar2) {
            if (uVar9 == 0xff) {
LAB_0010bc55:
              add_pair_to_block((EState *)strm);
LAB_0010bc5d:
              strm[1].total_in_lo32 = (uint)bVar2;
              strm[1].total_in_hi32 = 1;
            }
            else {
              strm[1].total_in_hi32 = uVar9 + 1;
            }
          }
          else {
            if (uVar9 != 1) {
              if (uVar7 < 0x100) goto LAB_0010bc55;
              goto LAB_0010bc5d;
            }
            strm[8].avail_in =
                 strm[8].avail_in << 8 ^ BZ2_crc32Table[strm[8].avail_in >> 0x18 ^ uVar7 & 0xff];
            *(undefined1 *)((long)&strm[1].state + (ulong)uVar7) = 1;
            strm->bzfree[iVar8] = (_func_void_void_ptr_void_ptr)(char)uVar7;
            piVar1 = (int *)((long)&strm[1].next_out + 4);
            *piVar1 = *piVar1 + 1;
            strm[1].total_in_lo32 = (uint)bVar2;
          }
          plVar11 = (long *)strm->next_in;
          pbVar12 = (byte *)(*plVar11 + 1);
          *plVar11 = (long)pbVar12;
          iVar13 = (int)plVar11[1] + -1;
          *(int *)(plVar11 + 1) = iVar13;
          piVar1 = (int *)((long)plVar11 + 0xc);
          *piVar1 = *piVar1 + 1;
          if (*piVar1 == 0) {
            *(int *)(plVar11 + 2) = (int)plVar11[2] + 1;
          }
          iVar8 = *(int *)((long)&strm[1].next_out + 4);
          uVar9 = strm[1].avail_out;
          bVar3 = 1;
        } while ((iVar8 < (int)uVar9) && (uVar7 = (uint)bVar2, iVar13 != 0));
      }
      else {
LAB_0010bd7b:
        bVar3 = 0;
      }
    }
    else {
      if ((((int)uVar9 <= iVar8) || (plVar11 = (long *)strm->next_in, (int)plVar11[1] == 0)) ||
         (strm->total_in_hi32 == 0)) goto LAB_0010bd7b;
      do {
        bVar3 = *(byte *)*plVar11;
        uVar7 = strm[1].total_in_lo32;
        uVar9 = strm[1].total_in_hi32;
        if (uVar7 == bVar3) {
          if (uVar9 == 0xff) {
LAB_0010bd2c:
            add_pair_to_block((EState *)strm);
LAB_0010bd34:
            strm[1].total_in_lo32 = (uint)bVar3;
            strm[1].total_in_hi32 = 1;
          }
          else {
            strm[1].total_in_hi32 = uVar9 + 1;
          }
        }
        else {
          if (uVar9 != 1) {
            if (uVar7 < 0x100) goto LAB_0010bd2c;
            goto LAB_0010bd34;
          }
          strm[8].avail_in =
               strm[8].avail_in << 8 ^ BZ2_crc32Table[uVar7 & 0xff ^ strm[8].avail_in >> 0x18];
          *(undefined1 *)((long)&strm[1].state + (ulong)uVar7) = 1;
          strm->bzfree[iVar8] = (_func_void_void_ptr_void_ptr)(char)uVar7;
          piVar1 = (int *)((long)&strm[1].next_out + 4);
          *piVar1 = *piVar1 + 1;
          strm[1].total_in_lo32 = (uint)bVar3;
        }
        plVar11 = (long *)strm->next_in;
        *plVar11 = *plVar11 + 1;
        iVar13 = (int)plVar11[1] + -1;
        *(int *)(plVar11 + 1) = iVar13;
        piVar1 = (int *)((long)plVar11 + 0xc);
        *piVar1 = *piVar1 + 1;
        if (*piVar1 == 0) {
          *(int *)(plVar11 + 2) = (int)plVar11[2] + 1;
        }
        iVar8 = *(int *)((long)&strm[1].next_out + 4);
        uVar7 = strm->total_in_hi32 - 1;
        strm->total_in_hi32 = uVar7;
        uVar9 = strm[1].avail_out;
        bVar3 = 1;
      } while (((iVar8 < (int)uVar9) && (iVar13 != 0)) && (uVar7 != 0));
    }
    bVar6 = (bool)(bVar6 | bVar3);
    uVar7 = strm->avail_in;
    if ((uVar7 == 2) || (strm->total_in_hi32 != 0)) break;
    if (strm[1].total_in_lo32 < 0x100) {
      add_pair_to_block((EState *)strm);
      uVar7 = strm->avail_in;
    }
    strm[1].total_in_lo32 = 0x100;
    strm[1].total_in_hi32 = 0;
    is_last_block = uVar7 == 4;
LAB_0010bdc7:
    BZ2_compressBlock((EState *)strm,is_last_block);
    strm->total_in_lo32 = 1;
  } while( true );
  if ((int)uVar9 <= iVar8) {
    is_last_block = false;
    goto LAB_0010bdc7;
  }
  if (*(int *)(strm->next_in + 8) == 0) {
LAB_0010bde1:
    return bVar5 || bVar6;
  }
  goto LAB_0010bab8;
}

Assistant:

static
Bool handle_compress ( bz_stream* strm )
{
   Bool progress_in  = False;
   Bool progress_out = False;
   EState* s = strm->state;

   while (True) {

      if (s->state == BZ_S_OUTPUT) {
         progress_out |= copy_output_until_stop ( s );
         if (s->state_out_pos < s->numZ) break;
         if (s->mode == BZ_M_FINISHING &&
             s->avail_in_expect == 0 &&
             isempty_RL(s)) break;
         prepare_new_block ( s );
         s->state = BZ_S_INPUT;
         if (s->mode == BZ_M_FLUSHING &&
             s->avail_in_expect == 0 &&
             isempty_RL(s)) break;
      }

      if (s->state == BZ_S_INPUT) {
         progress_in |= copy_input_until_stop ( s );
         if (s->mode != BZ_M_RUNNING && s->avail_in_expect == 0) {
            flush_RL ( s );
            BZ2_compressBlock ( s, (Bool)(s->mode == BZ_M_FINISHING) );
            s->state = BZ_S_OUTPUT;
         }
         else
         if (s->nblock >= s->nblockMAX) {
            BZ2_compressBlock ( s, False );
            s->state = BZ_S_OUTPUT;
         }
         else
         if (s->strm->avail_in == 0) {
            break;
         }
      }

   }

   return progress_in || progress_out;
}